

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

void encodeBase31(char *result,int value,int nrchars)

{
  int local_18;
  int local_14;
  int nrchars_local;
  int value_local;
  char *result_local;
  
  result[nrchars] = '\0';
  local_18 = nrchars;
  local_14 = value;
  while (0 < local_18) {
    local_18 = local_18 + -1;
    result[local_18] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[local_14 % 0x1f];
    local_14 = local_14 / 0x1f;
  }
  return;
}

Assistant:

static void encodeBase31(char *result, int value, int nrchars) {
    ASSERT(result);
    ASSERT(nrchars >= 0);
    result[nrchars] = 0; // zero-terminate!
    while (nrchars > 0) {
        nrchars--;
        result[nrchars] = ENCODE_CHARS[value % 31];
        value /= 31;
    }
}